

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O0

void __thiscall Tank::serverLoop(Tank *this)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  ostream *poVar4;
  allocator local_59;
  string local_58 [34];
  char local_36 [2];
  int local_34;
  char buf [2];
  char *pcStack_30;
  int readBytes;
  char *remoteAddr;
  socklen_t sockaddrLength;
  sockaddr_in sockaddr;
  int i;
  Tank *this_local;
  
  unique0x10000499 = this;
  if ((this->serverCreated & 1U) == 0) {
    bVar1 = createServer(this);
    this->serverCreated = bVar1;
  }
  do {
    memcpy(&this->tmpSet,&this->master,0x80);
    iVar2 = select(this->fdMax + 1,(fd_set *)&this->tmpSet,(fd_set *)0x0,(fd_set *)0x0,
                   (timeval *)0x0);
    if (iVar2 == -1) {
      perror("select");
      return;
    }
    sockaddr.sin_zero[0] = '\0';
    sockaddr.sin_zero[1] = '\0';
    sockaddr.sin_zero[2] = '\0';
    sockaddr.sin_zero[3] = '\0';
    for (; (int)sockaddr.sin_zero._0_4_ <= this->fdMax;
        sockaddr.sin_zero._0_4_ = sockaddr.sin_zero._0_4_ + 1) {
      if (((this->tmpSet).fds_bits[(int)sockaddr.sin_zero._0_4_ / 0x40] &
          1L << ((byte)((long)(int)sockaddr.sin_zero._0_4_ % 0x40) & 0x3f)) != 0) {
        if (sockaddr.sin_zero._0_4_ == this->listener) {
          if ((this->clientConnected & 1U) == 0) {
            remoteAddr._0_4_ = 0x10;
            iVar2 = accept(this->listener,(sockaddr *)((long)&remoteAddr + 4),
                           (socklen_t *)&remoteAddr);
            this->newSock = iVar2;
            if (this->newSock == -1) {
              printf("Cannot accept connection\n");
              return;
            }
            iVar2 = this->newSock / 0x40;
            (this->master).fds_bits[iVar2] =
                 1L << ((byte)((long)this->newSock % 0x40) & 0x3f) | (this->master).fds_bits[iVar2];
            if (this->fdMax < this->newSock) {
              this->fdMax = this->newSock;
            }
            getAddress(this,(sockaddr *)((long)&remoteAddr + 4),&stack0xffffffffffffffd0);
            printf("Connection accepted from IP %s\n",pcStack_30);
            free(pcStack_30);
          }
          else {
            std::operator<<((ostream *)&std::cerr,"Different client tried to connect");
          }
        }
        else {
          sVar3 = recv(sockaddr.sin_zero._0_4_,local_36,2,0);
          local_34 = (int)sVar3;
          if (local_34 < 1) {
            if (local_34 == 0) {
              printf("Socket %d is closed\n",(ulong)(uint)sockaddr.sin_zero._0_4_);
            }
            else {
              perror("recv");
            }
            close(sockaddr.sin_zero._0_4_);
            (this->master).fds_bits[(int)sockaddr.sin_zero._0_4_ / 0x40] =
                 (1L << ((byte)((long)(int)sockaddr.sin_zero._0_4_ % 0x40) & 0x3f) ^
                 0xffffffffffffffffU) & (this->master).fds_bits[(int)sockaddr.sin_zero._0_4_ / 0x40]
            ;
          }
          else {
            sVar3 = send(sockaddr.sin_zero._0_4_,local_36,(long)local_34,0);
            if (sVar3 == -1) {
              perror("send");
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_58,local_36,&local_59);
            std::__cxx11::string::operator=((string *)&this->command,local_58);
            std::__cxx11::string::~string(local_58);
            std::allocator<char>::~allocator((allocator<char> *)&local_59);
            poVar4 = std::operator<<((ostream *)&std::cout,"we got command! ");
            poVar4 = std::operator<<(poVar4,(string *)&this->command);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          }
        }
      }
    }
  } while( true );
}

Assistant:

void Tank::serverLoop()
{
    if(!serverCreated)
        serverCreated = this->createServer();
        // Run until the cows come home
        while (1) {
            // work with copy of master set
            tmpSet = master;
            // wait for data
            if (select(fdMax+1, &tmpSet, NULL, NULL, NULL) == -1) {
                perror("select");
                return;
            }
            // run through the existing connections looking for data to read
            int i;
            for(i = 0; i <= fdMax; i++) {
                // socket i has data to read
                if (FD_ISSET(i, &tmpSet)) {
                    if (i == listener) {
                        if(!clientConnected)
                        {
                            // handle new connections
                            struct sockaddr_in sockaddr;
                            socklen_t sockaddrLength = sizeof(sockaddr);
                            newSock = accept(listener, (struct sockaddr*) &sockaddr, &sockaddrLength);
                            if (newSock == -1) {
                                printf("Cannot accept connection\n");
                                return;
                            }
                            // add to master set
                            FD_SET(newSock, &master);
                            // watch out for new maximum
                            if (newSock > fdMax) {
                                fdMax = newSock;
                            }
                            char *remoteAddr;
                            getAddress((struct sockaddr*) &sockaddr, &remoteAddr);
                            printf("Connection accepted from IP %s\n", remoteAddr);
                            free(remoteAddr);
                        }
                        else
                        {
                            std::cerr << "Different client tried to connect";
                        }
                    } else {
                        // handle data from a client
                        int readBytes;
                        char buf[2];
                        if ((readBytes = recv(i, buf, sizeof buf, 0)) <= 0) {
                            // got error or connection closed by client
                            if (readBytes == 0) {
                            // connection closed
                            printf("Socket %d is closed\n", i);
                            } else {
                                perror("recv");
                            }
                            close(i); // bye!
                            FD_CLR(i, &master); // remove from master set
                        } else {
                            // we got some data from a client
                                        if (send(i, buf, readBytes, 0) == -1) {
                                            perror("send");
                                        }
                                        this->command = std::string(buf);
                                        std::cout << "we got command! " << this->command << std::endl;
                                    }
                                }
                            }
                        }
                    }
}